

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

upb_test_FakeMessageSet_Item *
upb_test_FakeMessageSet_add_item(upb_test_FakeMessageSet *msg,upb_Arena *arena)

{
  bool bVar1;
  upb_Array *array;
  upb_test_FakeMessageSet_Item *sub;
  upb_MiniTableField field;
  
  field.number_dont_copy_me__upb_internal_use_only = 1;
  field.offset_dont_copy_me__upb_internal_use_only = 8;
  field.presence = 0;
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\n';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  array = upb_Message_GetOrCreateMutableArray
                    (&msg->base_dont_copy_me__upb_internal_use_only,&field,arena);
  if (((array != (upb_Array *)0x0) &&
      (bVar1 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only
                         (array,array->size_dont_copy_me__upb_internal_use_only + 1,arena), bVar1))
     && (sub = (upb_test_FakeMessageSet_Item *)
               _upb_Message_New(&upb_0test__FakeMessageSet__Item_msg_init,arena),
        sub != (upb_test_FakeMessageSet_Item *)0x0)) {
    _upb_Array_Set_dont_copy_me__upb_internal_use_only
              (array,array->size_dont_copy_me__upb_internal_use_only - 1,&sub,8);
    return sub;
  }
  return (upb_test_FakeMessageSet_Item *)0x0;
}

Assistant:

UPB_INLINE struct upb_test_FakeMessageSet_Item* upb_test_FakeMessageSet_add_item(upb_test_FakeMessageSet* msg, upb_Arena* arena) {
  upb_MiniTableField field = {1, 8, 0, 0, 10, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__FakeMessageSet__Item_msg_init);
  upb_Array* arr = upb_Message_GetOrCreateMutableArray(
      UPB_UPCAST(msg), &field, arena);
  if (!arr || !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
                  arr, arr->UPB_PRIVATE(size) + 1, arena)) {
    return NULL;
  }
  struct upb_test_FakeMessageSet_Item* sub = (struct upb_test_FakeMessageSet_Item*)_upb_Message_New(&upb_0test__FakeMessageSet__Item_msg_init, arena);
  if (!arr || !sub) return NULL;
  UPB_PRIVATE(_upb_Array_Set)
  (arr, arr->UPB_PRIVATE(size) - 1, &sub, sizeof(sub));
  return sub;
}